

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  ImFontAtlasCustomRect *pIVar1;
  ImFont **ppIVar2;
  ImFont **ppIVar3;
  ImFontConfig *in_RDI;
  ImFont *unaff_retaddr;
  ImFont *font;
  ImFont **__end1;
  ImFont **__begin1;
  ImVector<ImFont_*> *__range1;
  ImVec2 uv1;
  ImVec2 uv0;
  ImFontAtlasCustomRect *r;
  int i;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImVec2 *in_stack_ffffffffffffffc0;
  ImFontAtlasCustomRect *in_stack_ffffffffffffffc8;
  ImFontAtlas *in_stack_ffffffffffffffd0;
  ImVector<ImFont_*> *this;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  float in_stack_fffffffffffffff0;
  int i_00;
  
  ImFontAtlasBuildRenderDefaultTexData(in_stack_ffffffffffffffd0);
  ImFontAtlasBuildRenderLinesTexData((ImFontAtlas *)uv1);
  for (i_00 = 0; i_00 < *(int *)(in_RDI->Name + 0xe); i_00 = i_00 + 1) {
    pIVar1 = ImVector<ImFontAtlasCustomRect>::operator[]
                       ((ImVector<ImFontAtlasCustomRect> *)(in_RDI->Name + 0xe),i_00);
    if ((pIVar1->Font != (ImFont *)0x0) && (pIVar1->GlyphID != 0)) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8);
      ImFontAtlas::CalcCustomRectUV
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8);
      ImFont::AddGlyph(unaff_retaddr,in_RDI,(ImWchar)((uint)i_00 >> 0x10),in_stack_fffffffffffffff0,
                       (float)((ulong)pIVar1 >> 0x20),SUB84(pIVar1,0),in_stack_ffffffffffffffe4,
                       in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                       ,(float)((ulong)in_stack_ffffffffffffffd0 >> 0x20),font._0_4_);
    }
  }
  this = (ImVector<ImFont_*> *)&in_RDI->EllipsisChar;
  ppIVar2 = ImVector<ImFont_*>::begin(this);
  ppIVar3 = ImVector<ImFont_*>::end(this);
  for (; ppIVar2 != ppIVar3; ppIVar2 = ppIVar2 + 1) {
    if (((*ppIVar2)->DirtyLookupTables & 1U) != 0) {
      ImFont::BuildLookupTable(unaff_retaddr);
    }
  }
  *(undefined1 *)&(in_RDI->GlyphExtraSpacing).y = 1;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (ImFont* font : atlas->Fonts)
        if (font->DirtyLookupTables)
            font->BuildLookupTable();

    atlas->TexReady = true;
}